

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# video_reader.c
# Opt level: O3

AvxVideoReader * aom_video_reader_open(char *filename)

{
  AvxInputContext *aom_ctx;
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  FILE *__stream;
  AvxVideoReader *__ptr;
  
  if ((*filename == '-') && (filename[1] == '\0')) {
    __stream = (FILE *)set_binary_mode(_stdin);
    bVar1 = true;
  }
  else {
    __stream = fopen64(filename,"rb");
    bVar1 = false;
  }
  if (__stream != (FILE *)0x0) {
    __ptr = (AvxVideoReader *)calloc(1,0x1b8);
    if (__ptr != (AvxVideoReader *)0x0) {
      aom_ctx = &__ptr->input_ctx;
      (__ptr->input_ctx).filename = filename;
      (__ptr->input_ctx).file = (FILE *)__stream;
      (__ptr->obu_ctx).avx_ctx = aom_ctx;
      (__ptr->obu_ctx).is_annexb = 1;
      if ((bVar1) || (iVar3 = file_is_webm(&__ptr->webm_ctx,aom_ctx), iVar3 == 0)) {
        iVar3 = file_is_ivf(aom_ctx);
        if (iVar3 == 0) {
          iVar3 = file_is_obu(&__ptr->obu_ctx);
          if (iVar3 == 0) {
            fclose(__stream);
            free(__ptr);
            return (AvxVideoReader *)0x0;
          }
          (__ptr->input_ctx).file_type = FILE_TYPE_OBU;
          (__ptr->info).codec_fourcc = 0x31305641;
          (__ptr->info).is_annexb = (__ptr->obu_ctx).is_annexb;
          return __ptr;
        }
        (__ptr->input_ctx).file_type = FILE_TYPE_IVF;
      }
      else {
        (__ptr->input_ctx).file_type = FILE_TYPE_WEBM;
      }
      (__ptr->info).codec_fourcc = (__ptr->input_ctx).fourcc;
      uVar2 = (__ptr->input_ctx).height;
      (__ptr->info).frame_width = (__ptr->input_ctx).width;
      (__ptr->info).frame_height = uVar2;
      return __ptr;
    }
    fclose(__stream);
  }
  return (AvxVideoReader *)0x0;
}

Assistant:

AvxVideoReader *aom_video_reader_open(const char *filename) {
  AvxVideoReader *reader = NULL;
  const bool using_file = strcmp(filename, "-") != 0;
  FILE *const file =
      using_file ? fopen(filename, "rb") : set_binary_mode(stdin);
  if (!file) return NULL;  // Can't open file

  reader = (AvxVideoReader *)calloc(1, sizeof(*reader));
  if (!reader) {
    fclose(file);
    return NULL;  // Can't allocate AvxVideoReader
  }

  reader->input_ctx.filename = filename;
  reader->input_ctx.file = file;
  reader->obu_ctx.avx_ctx = &reader->input_ctx;
  reader->obu_ctx.is_annexb = 1;

  // TODO(https://crbug.com/aomedia/1706): webm type does not support reading
  // from stdin yet, and file_is_webm is not using the detect buffer when
  // determining the type. Therefore it should only be checked when using a file
  // and needs to be checked prior to other types.
  if (false) {
#if CONFIG_WEBM_IO
  } else if (using_file &&
             file_is_webm(&reader->webm_ctx, &reader->input_ctx)) {
    reader->input_ctx.file_type = FILE_TYPE_WEBM;
    reader->info.codec_fourcc = reader->input_ctx.fourcc;
    reader->info.frame_width = reader->input_ctx.width;
    reader->info.frame_height = reader->input_ctx.height;
#endif
  } else if (file_is_ivf(&reader->input_ctx)) {
    reader->input_ctx.file_type = FILE_TYPE_IVF;
    reader->info.codec_fourcc = reader->input_ctx.fourcc;
    reader->info.frame_width = reader->input_ctx.width;
    reader->info.frame_height = reader->input_ctx.height;
  } else if (file_is_obu(&reader->obu_ctx)) {
    reader->input_ctx.file_type = FILE_TYPE_OBU;
    // assume AV1
    reader->info.codec_fourcc = AV1_FOURCC;
    reader->info.is_annexb = reader->obu_ctx.is_annexb;
  } else {
    fclose(file);
    free(reader);
    return NULL;  // Unknown file type
  }

  return reader;
}